

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<double> *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  uint uVar1;
  int iVar2;
  decimal_fp<double> *pdVar3;
  long lVar4;
  basic_appender<char> bVar5;
  byte bVar6;
  ulong uVar7;
  int **ppiVar8;
  size_t sVar9;
  int **ppiVar10;
  buffer<char> *buf;
  int iVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined8 uVar14;
  char cVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_40_8_fd1bf2f9 write;
  int num_zeros;
  undefined1 local_e6 [2];
  bool local_e4 [12];
  int local_d8;
  undefined1 local_d4 [12];
  format_specs local_c8;
  undefined1 local_b8 [20];
  undefined1 auStack_a4 [20];
  format_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int *local_60;
  int *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_d4._4_8_ = f->significand;
  lVar17 = 0x3f;
  if ((local_d4._4_8_ | 1) != 0) {
    for (; (local_d4._4_8_ | 1) >> lVar17 == 0; lVar17 = lVar17 + -1) {
    }
  }
  iVar11 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar17] -
           (uint)((ulong)local_d4._4_8_ <
                 (ulong)*(basic_specs *)
                         (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                         (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar17] * 8));
  uVar7 = (ulong)((iVar11 + 1) - (uint)(s == none));
  local_e6[1] = '0';
  uVar1 = (specs->super_basic_specs).data_;
  local_e6[0] = '.';
  local_e4._4_8_ = out.container;
  local_d8 = iVar11;
  local_d4._0_4_ = s;
  local_c8.super_basic_specs = (basic_specs)local_d4._4_8_;
  if ((uVar1 >> 0xe & 1) != 0) {
    local_c8.width = s;
    local_e6[0] = decimal_point_impl<char>(loc);
    uVar1 = (specs->super_basic_specs).data_;
    s = local_c8.width;
  }
  uVar14 = auStack_a4._4_8_;
  uVar12 = local_e4._4_8_;
  uVar16 = f->exponent;
  iVar19 = iVar11 + uVar16;
  iVar2 = specs->precision;
  bVar6 = (byte)uVar1 & 7;
  if (bVar6 == 1) goto LAB_0027f147;
  if ((uVar1 & 7) != 2) {
    if (iVar19 < -3) {
LAB_0027f147:
      iVar18 = iVar11 + -1 + uVar16;
      if ((uVar1 >> 0xd & 1) == 0) {
        uVar13 = 0;
        if (iVar11 == 1) {
          local_e6[0] = '\0';
          uVar13 = 0;
        }
      }
      else {
        uVar13 = 0;
        if (0 < iVar2 - iVar11) {
          uVar13 = (ulong)(uint)(iVar2 - iVar11);
        }
        uVar7 = uVar7 + uVar13;
      }
      iVar2 = 1 - iVar19;
      if (0 < iVar19) {
        iVar2 = iVar18;
      }
      lVar17 = 2;
      if (99 < iVar2) {
        lVar17 = (ulong)(999 < iVar2) + 3;
      }
      sVar9 = (3 - (ulong)(local_e6[0] == '\0')) + uVar7 + lVar17;
      local_b8._0_4_ = s;
      auStack_a4[0] = local_e6[0];
      local_b8._16_4_ = iVar11;
      auStack_a4._4_5_ = CONCAT14('0',(int)uVar13);
      auStack_a4._10_2_ = SUB82(uVar14,6);
      auStack_a4._4_8_ =
           CONCAT26(auStack_a4._10_2_,CONCAT15(((uVar1 >> 0xc & 1) == 0) << 5,auStack_a4._4_5_)) |
           0x450000000000;
      auStack_a4._12_4_ = iVar18;
      local_b8._8_8_ = local_d4._4_8_;
      if (specs->width < 1) {
        uVar7 = sVar9 + *(size_t *)(local_e4._4_8_ + 8);
        pdVar3 = f;
        if (*(size_t *)(local_e4._4_8_ + 0x10) < uVar7) {
          local_d4._4_8_ = f;
          (**(grow_fun *)(local_e4._4_8_ + 0x18))((buffer<char> *)local_e4._4_8_,uVar7);
          pdVar3 = (decimal_fp<double> *)local_d4._4_8_;
        }
        local_d4._4_8_ = pdVar3;
        bVar5 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<double>,_fmt::v11::detail::digit_grouping<char>_>
                ::anon_class_40_8_fd1bf2f9::operator()
                          ((anon_class_40_8_fd1bf2f9 *)local_b8,(iterator)uVar12);
      }
      else {
        local_d4._4_8_ = f;
        bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                          ((basic_appender<char>)local_e4._4_8_,specs,sVar9,sVar9,
                           (anon_class_40_8_fd1bf2f9 *)local_b8);
      }
      return (basic_appender<char>)bVar5.container;
    }
    if (0 < iVar2) {
      exp_upper = iVar2;
    }
    if (exp_upper < iVar19) goto LAB_0027f147;
  }
  local_c8.precision = iVar19;
  if (-1 < (int)uVar16) {
    lVar17 = uVar16 + uVar7;
    local_e4._0_4_ = iVar2 - iVar19;
    if ((uVar1 >> 0xd & 1) != 0) {
      lVar17 = lVar17 + 1;
      if (((int)local_e4._0_4_ < 1) && (bVar6 != 2)) {
        local_e4[0] = false;
        local_e4[1] = false;
        local_e4[2] = false;
        local_e4[3] = false;
      }
      else if (0 < (int)local_e4._0_4_) {
        lVar17 = lVar17 + (ulong)(uint)local_e4._0_4_;
      }
    }
    local_d4._4_8_ = f;
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
    iVar11 = 0;
    if (local_48 != (digit_grouping<char> *)0x0) {
      ppiVar10 = (int **)(local_70._8_8_ + local_70._M_allocated_capacity);
      lVar4 = 0;
      uVar14 = local_70._0_8_;
      do {
        if ((int **)uVar14 == ppiVar10) {
          cVar15 = *(char *)((long)ppiVar10 + -1);
          uVar14 = ppiVar10;
        }
        else {
          cVar15 = *(char *)uVar14;
          if ((byte)(cVar15 + 0x81U) < 0x82) goto LAB_0027f351;
          uVar14 = (int **)(uVar14 + 1);
        }
        iVar11 = iVar11 + cVar15;
        if (iVar19 <= iVar11) goto LAB_0027f351;
        lVar4 = lVar4 + 1;
      } while( true );
    }
    lVar4 = 0;
LAB_0027f351:
    local_b8._0_8_ = local_d4;
    local_b8._8_8_ = &local_c8;
    unique0x00004e80 = &local_d8;
    auStack_a4._4_8_ = local_d4._4_8_;
    local_88._M_allocated_capacity = (size_type)local_e6;
    local_88._8_8_ = local_e4;
    local_78 = local_e6 + 1;
    auStack_a4._12_8_ = &local_70;
    local_90 = specs;
    bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                      ((basic_appender<char>)uVar12,specs,lVar17 + lVar4,lVar17 + lVar4,
                       (anon_class_72_9_eb40e20e *)local_b8);
    if (local_50 != &local_40) {
      operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
    }
    uVar12 = local_60;
    uVar14 = local_70._0_8_;
    if ((int **)local_70._0_8_ == &local_60) {
      return (basic_appender<char>)bVar5.container;
    }
LAB_0027f4a7:
    operator_delete((void *)uVar14,uVar12 + 1);
    return (basic_appender<char>)bVar5.container;
  }
  if (0 < iVar19) {
    iVar18 = 0;
    local_e4._0_4_ = iVar2 - iVar11 & (int)(uVar1 << 0x12) >> 0x1f;
    uVar16 = local_e4._0_4_;
    if ((int)local_e4._0_4_ < 1) {
      uVar16 = 0;
    }
    local_d4._4_8_ = f;
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)local_b8,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
    if (local_90 != (format_specs *)0x0) {
      ppiVar8 = (int **)(local_b8._0_8_ + (long)(basic_specs *)local_b8._8_8_);
      lVar17 = 0;
      ppiVar10 = (int **)local_b8._0_8_;
      do {
        if (ppiVar10 == ppiVar8) {
          cVar15 = *(char *)((long)ppiVar8 + -1);
          ppiVar10 = ppiVar8;
        }
        else {
          cVar15 = *(char *)ppiVar10;
          if ((byte)(cVar15 + 0x81U) < 0x82) goto LAB_0027f412;
          ppiVar10 = (int **)((long)ppiVar10 + 1);
        }
        iVar18 = iVar18 + cVar15;
        if (iVar19 <= iVar18) goto LAB_0027f412;
        lVar17 = lVar17 + 1;
      } while( true );
    }
    lVar17 = 0;
LAB_0027f412:
    sVar9 = uVar16 + uVar7 + lVar17 + 1;
    local_70._M_allocated_capacity = (size_type)local_d4;
    local_70._8_8_ = &local_c8;
    local_60 = &local_d8;
    local_58 = &local_c8.precision;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e6;
    local_40._M_allocated_capacity = (size_type)local_e4;
    local_40._8_8_ = local_e6 + 1;
    local_48 = (digit_grouping<char> *)local_b8;
    bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                      ((basic_appender<char>)local_e4._4_8_,specs,sVar9,sVar9,
                       (anon_class_64_8_085c650e *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_a4._12_8_ != &local_88) {
      operator_delete((void *)auStack_a4._12_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    uVar12 = stack0xffffffffffffff58;
    uVar14 = local_b8._0_8_;
    if ((undefined1 *)local_b8._0_8_ == local_b8 + 0x10) {
      return (basic_appender<char>)bVar5.container;
    }
    goto LAB_0027f4a7;
  }
  iVar18 = -iVar19;
  local_70._M_allocated_capacity._0_4_ = iVar18;
  if (iVar11 == 0) {
    if ((-1 < iVar2) && (SBORROW4(iVar2,iVar18) != iVar2 + iVar19 < 0)) {
      local_70._M_allocated_capacity._0_4_ = iVar2;
      iVar18 = iVar2;
    }
    if (iVar18 == 0) {
      local_e4[0] = (bool)(char)((uVar1 & 0x2000) >> 0xd);
      iVar11 = 2 - (uint)((uVar1 & 0x2000) == 0);
      iVar18 = 0;
      goto LAB_0027f4e1;
    }
  }
  local_e4[0] = true;
  iVar11 = 2;
LAB_0027f4e1:
  sVar9 = (uint)(iVar18 + iVar11) + uVar7;
  local_b8._0_8_ = local_d4;
  local_b8._8_8_ = local_e4;
  unique0x00004e80 = local_e6;
  auStack_a4._4_8_ = &local_70;
  auStack_a4._12_8_ = local_e6 + 1;
  local_90 = &local_c8;
  local_88._M_allocated_capacity = (size_type)&local_d8;
  local_d4._4_8_ = f;
  bVar5 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                    ((basic_appender<char>)local_e4._4_8_,specs,sVar9,sVar9,
                     (anon_class_56_7_88befd79 *)local_b8);
  return (basic_appender<char>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}